

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu.cpp
# Opt level: O0

void __thiscall Vgm_Emu::mute_voices_(Vgm_Emu *this,int mask)

{
  bool bVar1;
  uint in_ESI;
  Music_Emu *in_RDI;
  Classic_Emu *unaff_retaddr;
  int m;
  Blip_Buffer *in_stack_ffffffffffffffc8;
  double dVar2;
  Sms_Apu *in_stack_ffffffffffffffd0;
  Blip_Synth<8,_1> *this_00;
  uint local_10;
  
  Classic_Emu::mute_voices_(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  Blip_Synth<8,_1>::output
            ((Blip_Synth<8,_1> *)&in_RDI[7].sample_rate_,(Blip_Buffer *)&in_RDI[3].equalizer_.bass);
  if ((in_RDI[9].super_Gme_File.playlist.first_error_ & 0x100) != 0) {
    Sms_Apu::output(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    bVar1 = Ym_Emu<Ym2612_Emu>::enabled
                      ((Ym_Emu<Ym2612_Emu> *)(in_RDI[3].super_Gme_File.playlist_warning + 0x28));
    if (bVar1) {
      this_00 = (Blip_Synth<8,_1> *)&in_RDI[7].sample_rate_;
      if ((in_ESI & 0x40) == 0) {
        dVar2 = Music_Emu::gain(in_RDI);
        dVar2 = dVar2 * 0.001306640625;
      }
      else {
        dVar2 = 0.0;
      }
      Blip_Synth<8,_1>::volume(this_00,dVar2);
      Ym2612_Emu::mute_voices
                ((Ym2612_Emu *)(in_RDI[3].super_Gme_File.playlist_warning + 0x28),in_ESI);
    }
    bVar1 = Ym_Emu<Ym2413_Emu>::enabled((Ym_Emu<Ym2413_Emu> *)&in_RDI[3].super_Gme_File.file_data);
    if (bVar1) {
      local_10 = in_ESI & 0x3f;
      if ((in_ESI & 0x20) != 0) {
        local_10 = local_10 | 0x1e0;
      }
      if ((in_ESI & 0x40) != 0) {
        local_10 = local_10 | 0x3e00;
      }
      Ym2413_Emu::mute_voices((Ym2413_Emu *)&in_RDI[3].super_Gme_File.file_data,local_10);
    }
  }
  return;
}

Assistant:

void Vgm_Emu::mute_voices_( int mask )
{
	Classic_Emu::mute_voices_( mask );
	dac_synth.output( &blip_buf );
	if ( uses_fm )
	{
		psg.output( (mask & 0x80) ? 0 : &blip_buf );
		if ( ym2612.enabled() )
		{
			dac_synth.volume( (mask & 0x40) ? 0.0 : 0.1115 / 256 * fm_gain * gain() );
			ym2612.mute_voices( mask );
		}
		
		if ( ym2413.enabled() )
		{
			int m = mask & 0x3F;
			if ( mask & 0x20 )
				m |= 0x01E0; // channels 5-8
			if ( mask & 0x40 )
				m |= 0x3E00;
			ym2413.mute_voices( m );
		}
	}
}